

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O3

ON_PointCloud *
ON_PointCloud::RandomSubsample
          (ON_PointCloud *source_point_cloud,uint subsample_point_count,
          ON_PointCloud *destination_point_cloud,ON_ProgressReporter *progress_reporter,
          ON_Terminator *terminator)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  anon_union_4_2_6147a14e_for_ON_Color_15 aVar4;
  ON_3dPoint *pOVar5;
  double dVar6;
  ON_3dVector *pOVar7;
  ON_Color *pOVar8;
  double *pdVar9;
  bool *pbVar10;
  uint uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  bool bVar15;
  ON__UINT32 OVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ON_3dPoint t;
  ON_RandomNumberGenerator gen;
  ON_PointCloud *local_a48;
  ON_RandomNumberGenerator local_9f4;
  
  if (subsample_point_count != 0 && source_point_cloud != (ON_PointCloud *)0x0) {
    uVar19 = (source_point_cloud->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count;
    if (subsample_point_count <= uVar19 && uVar19 - subsample_point_count != 0) {
      uVar17 = (source_point_cloud->m_N).m_count;
      uVar1 = (source_point_cloud->m_C).m_count;
      uVar2 = (source_point_cloud->m_V).m_count;
      uVar3 = (source_point_cloud->m_H).m_count;
      if (destination_point_cloud == (ON_PointCloud *)0x0) {
        local_a48 = (ON_PointCloud *)operator_new(0x148);
        ON_PointCloud(local_a48,source_point_cloud);
      }
      else {
        local_a48 = destination_point_cloud;
        if (source_point_cloud != destination_point_cloud) {
          Destroy(destination_point_cloud);
          operator=(destination_point_cloud,source_point_cloud);
        }
      }
      ON_RandomNumberGenerator::ON_RandomNumberGenerator(&local_9f4);
      ON_RandomNumberGenerator::Seed(&local_9f4);
      uVar22 = 0;
      uVar18 = uVar19;
      while ((uVar11 = uVar18 - 1, terminator == (ON_Terminator *)0x0 ||
             (bVar15 = ON_Terminator::TerminationRequested(terminator), !bVar15))) {
        if (progress_reporter != (ON_ProgressReporter *)0x0) {
          ON_ProgressReporter::ReportProgress
                    (progress_reporter,(double)uVar22 / (double)(uVar19 - subsample_point_count));
        }
        OVar16 = ON_RandomNumberGenerator::RandomNumber(&local_9f4);
        uVar18 = OVar16 % uVar18;
        if (uVar11 != uVar18) {
          pOVar5 = (local_a48->m_P).super_ON_SimpleArray<ON_3dPoint>.m_a;
          dVar6 = pOVar5[(int)uVar18].z;
          dVar12 = pOVar5[(int)uVar18].x;
          dVar13 = pOVar5[(int)uVar18].y;
          dVar14 = pOVar5[(int)uVar11].y;
          pOVar5[(int)uVar18].x = pOVar5[(int)uVar11].x;
          pOVar5[(int)uVar18].y = dVar14;
          pOVar5[(int)uVar18].z = pOVar5[(int)uVar11].z;
          pOVar5 = (local_a48->m_P).super_ON_SimpleArray<ON_3dPoint>.m_a;
          pOVar5[(int)uVar11].z = dVar6;
          pOVar5 = pOVar5 + (int)uVar11;
          pOVar5->x = dVar12;
          pOVar5->y = dVar13;
          if (uVar19 == uVar17) {
            pOVar7 = (local_a48->m_N).m_a;
            dVar6 = pOVar7[(int)uVar18].z;
            dVar12 = pOVar7[(int)uVar18].x;
            dVar13 = pOVar7[(int)uVar18].y;
            dVar14 = pOVar7[(int)uVar11].y;
            pOVar7[(int)uVar18].x = pOVar7[(int)uVar11].x;
            pOVar7[(int)uVar18].y = dVar14;
            pOVar7[(int)uVar18].z = pOVar7[(int)uVar11].z;
            pOVar7 = (local_a48->m_N).m_a;
            pOVar7[(int)uVar11].z = dVar6;
            pOVar7 = pOVar7 + (int)uVar11;
            pOVar7->x = dVar12;
            pOVar7->y = dVar13;
          }
          if (uVar19 == uVar1) {
            if (uVar11 == uVar18) goto LAB_00582f75;
            pOVar8 = (local_a48->m_C).m_a;
            aVar4 = pOVar8[(int)uVar18].field_0;
            pOVar8[(int)uVar18].field_0 = pOVar8[(int)uVar11].field_0;
            (local_a48->m_C).m_a[(int)uVar11].field_0 = aVar4;
            if (uVar19 == uVar2) goto LAB_00582f31;
          }
          else if (uVar19 == uVar2 && uVar11 != uVar18) {
LAB_00582f31:
            pdVar9 = (local_a48->m_V).m_a;
            dVar6 = pdVar9[(int)uVar18];
            pdVar9[(int)uVar18] = pdVar9[(int)uVar11];
            pdVar9[(int)uVar11] = dVar6;
          }
          if (uVar19 == uVar3 && uVar11 != uVar18) {
            pbVar10 = (local_a48->m_H).m_a;
            bVar15 = pbVar10[(int)uVar18];
            pbVar10[(int)uVar18] = pbVar10[(int)uVar11];
            pbVar10[(int)uVar11] = bVar15;
          }
        }
LAB_00582f75:
        if ((uVar11 == 0) || (uVar22 = uVar22 + 1, uVar18 = uVar11, subsample_point_count == uVar11)
           ) {
          if (progress_reporter != (ON_ProgressReporter *)0x0) {
            ON_ProgressReporter::ReportProgress(progress_reporter,1.0);
          }
          if (((int)subsample_point_count < 0) ||
             ((local_a48->m_P).super_ON_SimpleArray<ON_3dPoint>.m_capacity <
              (int)subsample_point_count)) {
            uVar18 = (local_a48->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count;
          }
          else {
            (local_a48->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count = subsample_point_count;
            uVar18 = subsample_point_count;
          }
          ON_SimpleArray<ON_3dPoint>::SetCapacity
                    (&(local_a48->m_P).super_ON_SimpleArray<ON_3dPoint>,(long)(int)uVar18);
          if (uVar19 == uVar17) {
            if (((int)subsample_point_count < 0) ||
               ((local_a48->m_N).m_capacity < (int)subsample_point_count)) {
              uVar17 = (local_a48->m_N).m_count;
            }
            else {
              (local_a48->m_N).m_count = subsample_point_count;
              uVar17 = subsample_point_count;
            }
            ON_SimpleArray<ON_3dVector>::SetCapacity(&local_a48->m_N,(long)(int)uVar17);
          }
          if (uVar19 == uVar1) {
            if (((int)subsample_point_count < 0) ||
               ((local_a48->m_C).m_capacity < (int)subsample_point_count)) {
              uVar17 = (local_a48->m_C).m_count;
            }
            else {
              (local_a48->m_C).m_count = subsample_point_count;
              uVar17 = subsample_point_count;
            }
            ON_SimpleArray<ON_Color>::SetCapacity(&local_a48->m_C,(long)(int)uVar17);
          }
          if (uVar19 == uVar2) {
            if (((int)subsample_point_count < 0) ||
               ((local_a48->m_V).m_capacity < (int)subsample_point_count)) {
              uVar17 = (local_a48->m_V).m_count;
            }
            else {
              (local_a48->m_V).m_count = subsample_point_count;
              uVar17 = subsample_point_count;
            }
            ON_SimpleArray<double>::SetCapacity(&local_a48->m_V,(long)(int)uVar17);
          }
          if (uVar19 != uVar3) {
            return local_a48;
          }
          if (((int)subsample_point_count < 0) ||
             ((local_a48->m_H).m_capacity < (int)subsample_point_count)) {
            subsample_point_count = (local_a48->m_H).m_count;
          }
          else {
            (local_a48->m_H).m_count = subsample_point_count;
          }
          ON_SimpleArray<bool>::SetCapacity(&local_a48->m_H,(long)(int)subsample_point_count);
          local_a48->m_hidden_count = 0;
          uVar21 = (ulong)(uint)(local_a48->m_H).m_count;
          if (uVar21 == 0) {
            return local_a48;
          }
          pbVar10 = (local_a48->m_H).m_a;
          uVar19 = 0;
          uVar20 = 0;
          do {
            if (pbVar10[uVar20] == true) {
              uVar19 = uVar19 + 1;
              local_a48->m_hidden_count = uVar19;
            }
            uVar20 = uVar20 + 1;
          } while (uVar21 != uVar20);
          return local_a48;
        }
      }
      if (local_a48 != source_point_cloud) {
        Destroy(local_a48);
      }
      if (destination_point_cloud == (ON_PointCloud *)0x0) {
        (*(local_a48->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
      }
    }
  }
  return (ON_PointCloud *)0x0;
}

Assistant:

ON_PointCloud* ON_PointCloud::RandomSubsample(
  const ON_PointCloud* source_point_cloud,
  const unsigned int subsample_point_count,
  ON_PointCloud* destination_point_cloud,
  ON_ProgressReporter* progress_reporter,
  ON_Terminator* terminator
)
{
  if (
       nullptr == source_point_cloud 
    || subsample_point_count <= 0 
    || subsample_point_count >= source_point_cloud->m_P.UnsignedCount()
    )
    return nullptr;

  const unsigned int point_count = source_point_cloud->m_P.UnsignedCount();
  const unsigned int points_to_remove = point_count - subsample_point_count;
  if (points_to_remove <= 0)
    return nullptr;

  const bool bHaveNormals = point_count == source_point_cloud->m_N.UnsignedCount();
  const bool bHaveColors = point_count == source_point_cloud->m_C.UnsignedCount();
  const bool bHaveValues = point_count == source_point_cloud->m_V.UnsignedCount();
  const bool bHaveHidden = point_count == source_point_cloud->m_H.UnsignedCount();

  bool bAlloc = false;
  if (destination_point_cloud)
  {
    if (source_point_cloud != destination_point_cloud)
    {
      destination_point_cloud->Destroy();
      *destination_point_cloud = *source_point_cloud;
    }
  }
  else
  {
    destination_point_cloud = new ON_PointCloud(*source_point_cloud);
    bAlloc = true;
  }

  ON_RandomNumberGenerator gen;
  gen.Seed();

  unsigned int last_point_count = point_count;
  for (unsigned int i = 0; i < points_to_remove; i++)
  {
    if (terminator && ON_Terminator::TerminationRequested(terminator))
    {
      if (source_point_cloud != destination_point_cloud)
        destination_point_cloud->Destroy();
      if (bAlloc)
        delete destination_point_cloud;
      return nullptr;
    }

    if (progress_reporter)
      ON_ProgressReporter::ReportProgress(progress_reporter, i / (double)points_to_remove);

    // For (min <= r < max): min + RandomNumber() % (max-min)
    const int point_index = gen.RandomNumber() % last_point_count;

    destination_point_cloud->m_P.Swap(point_index, last_point_count - 1);
    if (bHaveNormals)
      destination_point_cloud->m_N.Swap(point_index, last_point_count - 1);
    if (bHaveColors)
      destination_point_cloud->m_C.Swap(point_index, last_point_count - 1);
    if (bHaveValues)
      destination_point_cloud->m_V.Swap(point_index, last_point_count - 1);
    if (bHaveHidden)
      destination_point_cloud->m_H.Swap(point_index, last_point_count - 1);

    last_point_count--;
    if (last_point_count <= 0)
      break;
  }

  if (progress_reporter)
    ON_ProgressReporter::ReportProgress(progress_reporter, 1.0);

  destination_point_cloud->m_P.SetCount(subsample_point_count);
  destination_point_cloud->m_P.Shrink();
  if (bHaveNormals)
  {
    destination_point_cloud->m_N.SetCount(subsample_point_count);
    destination_point_cloud->m_N.Shrink();
  }
  if (bHaveColors)
  {
    destination_point_cloud->m_C.SetCount(subsample_point_count);
    destination_point_cloud->m_C.Shrink();
  }
  if (bHaveValues)
  {
    destination_point_cloud->m_V.SetCount(subsample_point_count);
    destination_point_cloud->m_V.Shrink();
  }
  if (bHaveHidden)
  {
    destination_point_cloud->m_H.SetCount(subsample_point_count);
    destination_point_cloud->m_H.Shrink();
    destination_point_cloud->m_hidden_count = 0;
    for (unsigned int i = 0; i < destination_point_cloud->m_H.UnsignedCount(); i++)
    {
      if (destination_point_cloud->m_H[i])
        destination_point_cloud->m_hidden_count++;
    }
  }

  return destination_point_cloud;
}